

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmove_s.c
# Opt level: O1

void * memmove_xplat(void *dst,void *src,size_t count)

{
  void *pvVar1;
  
  pvVar1 = memmove(dst,src,count);
  return pvVar1;
}

Assistant:

void* __cdecl memmove_xplat(
    void * dst,
    const void * src,
    size_t count
)
{
#if defined(__APPLE__) || defined(__FreeBSD__)
    if (src <= dst && src + count > dst)
    {
        char *temp = (char*) malloc(count);
        _VALIDATE_RETURN_ERRCODE(temp != NULL, NULL);

        memcpy(temp, src, count);
        memcpy(dst, temp, count);

        free(temp);
        return dst;
    }
#endif

    return memmove(dst, src, count);
}